

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O2

void __thiscall DIS::EntityType::marshal(EntityType *this,DataStream *dataStream)

{
  DataStream::operator<<(dataStream,this->_entityKind);
  DataStream::operator<<(dataStream,this->_domain);
  DataStream::operator<<(dataStream,this->_country);
  DataStream::operator<<(dataStream,this->_category);
  DataStream::operator<<(dataStream,this->_subcategory);
  DataStream::operator<<(dataStream,this->_specific);
  DataStream::operator<<(dataStream,this->_extra);
  return;
}

Assistant:

void EntityType::marshal(DataStream& dataStream) const
{
    dataStream << _entityKind;
    dataStream << _domain;
    dataStream << _country;
    dataStream << _category;
    dataStream << _subcategory;
    dataStream << _specific;
    dataStream << _extra;
}